

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

bool __thiscall
optimization::global_expr_move::BlockOps::disable_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  variant_alternative_t<1UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *pvVar1;
  size_type sVar2;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> local_50;
  
  if ((op->
      super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ).
      super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ._M_index != '\0') {
    pvVar1 = std::
             get<1ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                       (op);
    std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::pair
              (&local_50,pvVar1);
    sVar2 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            count(&this->stores,(key_type *)&local_50);
    return sVar2 != 0;
  }
  return false;
}

Assistant:

bool disable_op(std::variant<Op, LoadOp> op) {
    if (op.index() == 0) {
      return false;
    } else {
      auto load = std::get<LoadOp>(op);
      return stores.count(load.first.first);
    }
  }